

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLMaterialRenderer.h
# Opt level: O0

void __thiscall
irr::video::COpenGLMaterialRenderer_TRANSPARENT_ALPHA_CHANNEL::OnUnsetMaterial
          (COpenGLMaterialRenderer_TRANSPARENT_ALPHA_CHANNEL *this)

{
  COpenGLCacheHandler *in_RDI;
  GLenum in_stack_ffffffffffffffec;
  undefined1 enable;
  
  COpenGLDriver::getCacheHandler
            ((in_RDI->
             super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
             ).Driver);
  COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
  ::setActiveTexture(&in_RDI->
                      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                     ,in_stack_ffffffffffffffec);
  enable = (undefined1)(in_stack_ffffffffffffffec >> 0x18);
  glTexEnvi(0x2300,0x2200,0x2100);
  glTexEnvi(0x2300,0x8572,0x2100);
  COpenGLDriver::getCacheHandler
            ((in_RDI->
             super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
             ).Driver);
  COpenGLCacheHandler::setAlphaTest(in_RDI,(bool)enable);
  COpenGLDriver::getCacheHandler
            ((in_RDI->
             super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
             ).Driver);
  COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
  ::setBlend(&in_RDI->
              super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
             ,(bool)enable);
  return;
}

Assistant:

void OnUnsetMaterial() override
	{
		Driver->getCacheHandler()->setActiveTexture(GL_TEXTURE0_ARB);

		glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, GL_MODULATE);
#ifdef GL_ARB_texture_env_combine
		glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_ALPHA_ARB, GL_MODULATE);
#else
		glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_ALPHA_EXT, GL_MODULATE);
#endif
		Driver->getCacheHandler()->setAlphaTest(false);
		Driver->getCacheHandler()->setBlend(false);
	}